

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_Error ft_gzip_check_header(FT_Stream stream)

{
  byte bVar1;
  FT_UInt16 FVar2;
  FT_Error FVar3;
  FT_UInt c_1;
  FT_UInt c;
  FT_UInt len;
  FT_Byte head [4];
  FT_Error error;
  FT_Stream stream_local;
  
  _head = stream;
  len = FT_Stream_Seek(stream,0);
  if (len != 0) {
    return len;
  }
  len = FT_Stream_Read(_head,(FT_Byte *)&c,4);
  if (len != 0) {
    return len;
  }
  if (((((char)c != '\x1f') || (c._1_1_ != -0x75)) || (c._2_1_ != '\b')) || ((c._3_1_ & 0xe0) != 0))
  {
    return 3;
  }
  len = FT_Stream_Skip(_head,6);
  if ((c._3_1_ & 4) != 0) {
    FVar2 = FT_Stream_ReadUShortLE(_head,(FT_Error *)&len);
    if (len != 0) {
      return len;
    }
    len = FT_Stream_Skip(_head,(ulong)FVar2);
    if (len != 0) {
      return len;
    }
  }
  bVar1 = c._3_1_ & 8;
  do {
    if (bVar1 == 0) {
      bVar1 = c._3_1_ & 0x10;
      do {
        if (bVar1 == 0) {
          if ((c._3_1_ & 2) == 0) {
            return len;
          }
          FVar3 = FT_Stream_Skip(_head,2);
          return FVar3;
        }
        bVar1 = FT_Stream_ReadByte(_head,(FT_Error *)&len);
      } while (len == 0);
      return len;
    }
    bVar1 = FT_Stream_ReadByte(_head,(FT_Error *)&len);
  } while (len == 0);
  return len;
}

Assistant:

static FT_Error
  ft_gzip_check_header( FT_Stream  stream )
  {
    FT_Error  error;
    FT_Byte   head[4];


    if ( FT_STREAM_SEEK( 0 )       ||
         FT_STREAM_READ( head, 4 ) )
      goto Exit;

    /* head[0] && head[1] are the magic numbers;    */
    /* head[2] is the method, and head[3] the flags */
    if ( head[0] != 0x1F              ||
         head[1] != 0x8B              ||
         head[2] != Z_DEFLATED        ||
        (head[3] & FT_GZIP_RESERVED)  )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* skip time, xflags and os code */
    (void)FT_STREAM_SKIP( 6 );

    /* skip the extra field */
    if ( head[3] & FT_GZIP_EXTRA_FIELD )
    {
      FT_UInt  len;


      if ( FT_READ_USHORT_LE( len ) ||
           FT_STREAM_SKIP( len )    )
        goto Exit;
    }

    /* skip original file name */
    if ( head[3] & FT_GZIP_ORIG_NAME )
      for (;;)
      {
        FT_UInt  c;


        if ( FT_READ_BYTE( c ) )
          goto Exit;

        if ( c == 0 )
          break;
      }

    /* skip .gz comment */
    if ( head[3] & FT_GZIP_COMMENT )
      for (;;)
      {
        FT_UInt  c;


        if ( FT_READ_BYTE( c ) )
          goto Exit;

        if ( c == 0 )
          break;
      }

    /* skip CRC */
    if ( head[3] & FT_GZIP_HEAD_CRC )
      if ( FT_STREAM_SKIP( 2 ) )
        goto Exit;

  Exit:
    return error;
  }